

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local-graph.h
# Opt level: O2

GetInfluences * __thiscall wasm::LocalGraph::getGetInfluences(LocalGraph *this,LocalGet *get)

{
  int iVar1;
  const_iterator cVar2;
  GetInfluences *pGVar3;
  LocalGet *local_18;
  LocalGet *get_local;
  
  local_18 = get;
  cVar2 = std::
          _Hashtable<wasm::LocalGet_*,_std::pair<wasm::LocalGet_*const,_std::unordered_set<wasm::LocalSet_*,_std::hash<wasm::LocalSet_*>,_std::equal_to<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>,_std::allocator<std::pair<wasm::LocalGet_*const,_std::unordered_set<wasm::LocalSet_*,_std::hash<wasm::LocalSet_*>,_std::equal_to<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::LocalGet_*>,_std::hash<wasm::LocalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->getInfluences)._M_h,&local_18);
  if (cVar2.
      super__Node_iterator_base<std::pair<wasm::LocalGet_*const,_std::unordered_set<wasm::LocalSet_*,_std::hash<wasm::LocalSet_*>,_std::equal_to<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>,_false>
      ._M_cur == (__node_type *)0x0) {
    pGVar3 = &getGetInfluences::empty;
    if (getGetInfluences(wasm::LocalGet*)::empty == '\0') {
      iVar1 = __cxa_guard_acquire(&getGetInfluences(wasm::LocalGet*)::empty);
      if (iVar1 != 0) {
        pGVar3 = &getGetInfluences::empty;
        getGetInfluences::empty._M_h._M_buckets = &getGetInfluences::empty._M_h._M_single_bucket;
        getGetInfluences::empty._M_h._M_bucket_count = 1;
        getGetInfluences::empty._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        getGetInfluences::empty._M_h._M_element_count = 0;
        getGetInfluences::empty._M_h._M_rehash_policy._M_max_load_factor = 1.0;
        getGetInfluences::empty._M_h._M_rehash_policy._M_next_resize = 0;
        getGetInfluences::empty._M_h._M_single_bucket = (__node_base_ptr)0x0;
        __cxa_atexit(std::
                     unordered_set<wasm::LocalSet_*,_std::hash<wasm::LocalSet_*>,_std::equal_to<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>
                     ::~unordered_set,&getGetInfluences::empty,&__dso_handle);
        __cxa_guard_release(&getGetInfluences(wasm::LocalGet*)::empty);
      }
    }
  }
  else {
    pGVar3 = (GetInfluences *)
             ((long)cVar2.
                    super__Node_iterator_base<std::pair<wasm::LocalGet_*const,_std::unordered_set<wasm::LocalSet_*,_std::hash<wasm::LocalSet_*>,_std::equal_to<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>,_false>
                    ._M_cur + 0x10);
  }
  return pGVar3;
}

Assistant:

const GetInfluences& getGetInfluences(LocalGet* get) const {
    auto iter = getInfluences.find(get);
    if (iter == getInfluences.end()) {
      // Use a canonical constant empty set to avoid allocation.
      static const GetInfluences empty;
      return empty;
    }
    return iter->second;
  }